

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O2

bool TimeFunctionParallel(TimeResults *results,function<bool_()> *func)

{
  _Manager_type p_Var1;
  pointer __first;
  pointer __last;
  bool bVar2;
  uint32_t uVar3;
  ThreadResult *__cur;
  size_type __n;
  pointer __result;
  thread *ptVar4;
  allocator_type *__a;
  pointer pTVar5;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX_00;
  anon_class_40_5_9d02135f_for__M_head_impl *__args;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX_01;
  anon_class_40_5_9d02135f_for__M_head_impl *__args_00;
  int iVar6;
  thread *thread;
  long lVar7;
  allocator_type *paVar8;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  uint64_t uVar9;
  uint64_t uVar10;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  uint32_t iterations_between_time_checks;
  vector<ThreadResult,_std::allocator<ThreadResult>_> local_120;
  _Any_data local_108;
  _Manager_type local_f8;
  _Invoker_type local_f0;
  function<bool_()> *local_e0;
  thread local_d8;
  Latch *local_d0;
  vector<ThreadResult,_std::allocator<ThreadResult>_> *local_c8;
  function<bool_()> *local_c0;
  uint32_t *local_b8;
  function<bool_()> local_b0;
  Latch latch;
  
  if (g_threads < 2) {
    local_108 = (_Any_data)0x0;
    local_f8 = (_Manager_type)0x0;
    local_f0 = func->_M_invoker;
    p_Var1 = (func->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_108 = (func->super__Function_base)._M_functor;
      *(undefined1 (*) [16])&(func->super__Function_base)._M_manager = (undefined1  [16])0x0;
      local_f8 = p_Var1;
    }
    bVar2 = TimeFunction(results,(function<bool_()> *)&local_108);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
  }
  else {
    std::function<bool_()>::function(&local_b0,func);
    uVar3 = IterationsBetweenTimeChecks(&local_b0);
    std::_Function_base::~_Function_base(&local_b0.super__Function_base);
    if (uVar3 == 0) {
      bVar2 = false;
    }
    else {
      lVar7 = (long)g_threads;
      iterations_between_time_checks = uVar3;
      if (lVar7 < 0) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      if (g_threads == 0) {
        local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
      else {
        local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(lVar7 * 0x18);
      }
      local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
           super__Vector_impl_data._M_start + lVar7;
      local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
           super__Vector_impl_data._M_start;
      while (bVar2 = lVar7 != 0, lVar7 = lVar7 + -1, bVar2) {
        ((local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
          super__Vector_impl_data._M_finish)->time_result).num_calls = 0;
        ((local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
          super__Vector_impl_data._M_finish)->time_result).us = 0;
        *(undefined8 *)
         &(local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
           super__Vector_impl_data._M_finish)->ok = 0;
        local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      Latch::Latch(&latch,g_threads);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __a = (allocator_type *)0x0;
      __args_00 = extraout_RDX;
      local_e0 = func;
      for (iVar6 = 0; iVar6 < g_threads; iVar6 = iVar6 + 1) {
        local_d0 = &latch;
        local_c8 = &local_120;
        local_b8 = &iterations_between_time_checks;
        local_d8._M_id._M_thread._0_4_ = iVar6;
        local_c0 = func;
        if (__a == (allocator_type *)
                   threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
          __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          (&threads,1,"vector::_M_realloc_insert");
          __first = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          __last = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                               (&threads.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>,__n);
          std::allocator_traits<std::allocator<std::thread>>::
          construct<std::thread,TimeFunctionParallel(TimeResults*,std::function<bool()>)::__0>
                    ((allocator_type *)(((long)__a - (long)__first) + (long)__result),&local_d8,
                     __args);
          ptVar4 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                             (__first,(thread *)__a,__result,(allocator<std::thread> *)&threads);
          __a = (allocator_type *)
                std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                          ((thread *)__a,__last,ptVar4 + 1,(allocator<std::thread> *)&threads);
          std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                    (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,__first,
                     (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first >> 3);
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)__a;
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = __result;
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = __result + __n;
          __args_00 = extraout_RDX_01;
          func = local_e0;
        }
        else {
          std::allocator_traits<std::allocator<std::thread>>::
          construct<std::thread,TimeFunctionParallel(TimeResults*,std::function<bool()>)::__0>
                    (__a,&local_d8,__args_00);
          __a = (allocator_type *)
                (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1);
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)__a;
          __args_00 = extraout_RDX_00;
        }
      }
      for (paVar8 = (allocator_type *)
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start; paVar8 != __a; paVar8 = paVar8 + 8) {
        std::thread::join();
      }
      uVar9 = 0;
      uVar10 = 0;
      results->num_calls = 0;
      results->us = 0;
      for (pTVar5 = local_120.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          (bVar2 = pTVar5 == local_120.
                             super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl
                             .super__Vector_impl_data._M_finish, !bVar2 && (pTVar5->ok == true));
          pTVar5 = pTVar5 + 1) {
        uVar9 = uVar9 + (pTVar5->time_result).num_calls;
        uVar10 = uVar10 + (pTVar5->time_result).us;
        results->num_calls = uVar9;
        results->us = uVar10;
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
      std::condition_variable::~condition_variable(&latch.cond_);
      std::vector<ThreadResult,_std::allocator<ThreadResult>_>::~vector(&local_120);
    }
  }
  return bVar2;
}

Assistant:

static bool TimeFunctionParallel(TimeResults *results,
                                 std::function<bool()> func) {
  if (g_threads <= 1) {
    return TimeFunction(results, std::move(func));
  }

  uint32_t iterations_between_time_checks = IterationsBetweenTimeChecks(func);
  if (iterations_between_time_checks == 0) {
    return false;
  }

  struct ThreadResult {
    TimeResults time_result;
    bool ok = false;
  };
  std::vector<ThreadResult> thread_results(g_threads);
  Latch latch(g_threads);
  std::vector<std::thread> threads;
  for (int i = 0; i < g_threads; i++) {
    threads.emplace_back([&, i] {
      // Wait for all the threads to be ready before running the benchmark.
      latch.ArriveAndWait();
      thread_results[i].ok = TimeFunctionImpl(
          &thread_results[i].time_result, func, iterations_between_time_checks);
    });
  }

  for (auto &thread : threads) {
    thread.join();
  }

  results->num_calls = 0;
  results->us = 0;
  for (const auto &pair : thread_results) {
    if (!pair.ok) {
      return false;
    }
    results->num_calls += pair.time_result.num_calls;
    results->us += pair.time_result.us;
  }
  return true;
}